

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignmentExpressions.cpp
# Opt level: O3

span<const_slang::ast::Expression_*const,_18446744073709551615UL> __thiscall
slang::ast::bindExpressionList
          (ast *this,Type *patternType,Type *elementType,size_t replCount,bitwidth_t expectedCount,
          SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *items,ASTContext *context,
          SourceRange sourceRange,bool *bad)

{
  uint uVar1;
  SourceRange sourceRange_00;
  bool bVar2;
  byte bVar3;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar4;
  Expression *pEVar5;
  Diagnostic *pDVar6;
  undefined4 extraout_var;
  Type *extraout_RDX;
  Type *extraout_RDX_00;
  __extent_storage<18446744073709551615UL> extraout_RDX_01;
  long lVar7;
  ulong uVar8;
  undefined4 in_register_00000084;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> sVar9;
  SmallVector<const_slang::ast::Expression_*,_5UL> elems;
  Expression *local_90;
  uint local_84;
  Type *local_80;
  Type *local_78;
  SmallVectorBase<const_slang::ast::Expression_*> local_70 [2];
  
  local_84 = (uint)replCount;
  uVar1 = *(uint *)&(items->super_SyntaxListBase).super_SyntaxNode.parent;
  local_70[0].data_ = (pointer)local_70[0].firstElement;
  local_70[0].len = 0;
  local_70[0].cap = 5;
  uVar8 = *(long *)(CONCAT44(in_register_00000084,expectedCount) + 0x30) + 1;
  local_80 = (Type *)this;
  local_78 = elementType;
  if (uVar8 < 2) {
    bVar3 = *(byte *)sourceRange.endLoc;
  }
  else {
    uVar8 = uVar8 >> 1;
    lVar7 = 0;
    do {
      ppSVar4 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                          ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                           (*(long *)(CONCAT44(in_register_00000084,expectedCount) + 0x28) + lVar7))
      ;
      pEVar5 = Expression::bindArgument
                         (patternType,uVar1 >> 0x14 & Out,(bitmask<slang::ast::VariableFlags>)0x0,
                          (ExpressionSyntax *)*ppSVar4,(ASTContext *)items);
      local_90 = pEVar5;
      SmallVectorBase<slang::ast::Expression_const*>::emplace_back<slang::ast::Expression_const*>
                ((SmallVectorBase<slang::ast::Expression_const*> *)local_70,&local_90);
      bVar2 = Expression::bad(pEVar5);
      bVar3 = bVar2 | *(byte *)sourceRange.endLoc;
      *(byte *)sourceRange.endLoc = bVar3;
      lVar7 = lVar7 + 0x30;
      uVar8 = uVar8 - 1;
      elementType = extraout_RDX;
    } while (uVar8 != 0);
  }
  if (((local_84 != 0) && ((bVar3 & 1) == 0)) &&
     (pEVar5 = (Expression *)(ulong)local_84, (long)local_78 * local_70[0].len - (long)pEVar5 != 0))
  {
    sourceRange_00.endLoc = sourceRange.startLoc;
    sourceRange_00.startLoc = (SourceLocation)context;
    pDVar6 = ASTContext::addDiag((ASTContext *)items,(DiagCode)0xae0007,sourceRange_00);
    pDVar6 = operator<<(pDVar6,local_80);
    local_90 = pEVar5;
    std::
    vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
    ::emplace_back<unsigned_long>(&pDVar6->args,(unsigned_long *)&local_90);
    local_90 = (Expression *)local_70[0].len;
    std::
    vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
    ::emplace_back<unsigned_long>(&pDVar6->args,(unsigned_long *)&local_90);
    *(undefined1 *)sourceRange.endLoc = 1;
    elementType = extraout_RDX_00;
  }
  sVar9._M_ptr._0_4_ =
       SmallVectorBase<const_slang::ast::Expression_*>::copy
                 (local_70,(EVP_PKEY_CTX *)*(items->super_SyntaxListBase)._vptr_SyntaxListBase,
                  (EVP_PKEY_CTX *)elementType);
  sVar9._M_ptr._4_4_ = extraout_var;
  if (local_70[0].data_ != (pointer)local_70[0].firstElement) {
    operator_delete(local_70[0].data_);
  }
  sVar9._M_extent._M_extent_value = extraout_RDX_01._M_extent_value;
  return sVar9;
}

Assistant:

static std::span<const Expression* const> bindExpressionList(
    const Type& patternType, const Type& elementType, size_t replCount, bitwidth_t expectedCount,
    const SeparatedSyntaxList<ExpressionSyntax>& items, const ASTContext& context,
    SourceRange sourceRange, bool& bad) {

    const bool isLValue = context.flags.has(ASTFlags::LValue);
    auto direction = isLValue ? ArgumentDirection::Out : ArgumentDirection::In;

    SmallVector<const Expression*> elems;
    for (auto item : items) {
        auto& expr = Expression::bindArgument(elementType, direction, {}, *item, context);
        elems.push_back(&expr);
        bad |= expr.bad();
    }

    if (!bad && expectedCount && expectedCount != elems.size() * replCount) {
        auto& diag = context.addDiag(diag::WrongNumberAssignmentPatterns, sourceRange);
        diag << patternType << expectedCount << elems.size();
        bad = true;
    }

    return elems.copy(context.getCompilation());
}